

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_kvs_set_seqnum(filemgr *file,fdb_kvs_id_t id,fdb_seqnum_t seqnum)

{
  long lVar1;
  avl_node *paVar2;
  avl_node *in_RDX;
  avl_tree *in_RSI;
  long in_RDI;
  avl_node *a;
  kvs_node *node;
  kvs_node query;
  kvs_header *kv_header;
  fdb_seqnum_t in_stack_fffffffffffffef8;
  filemgr *in_stack_ffffffffffffff00;
  avl_cmp_func *in_stack_ffffffffffffff08;
  avl_node *in_stack_ffffffffffffff10;
  
  lVar1 = *(long *)(in_RDI + 0x170);
  if (in_RSI == (avl_tree *)0x0) {
    filemgr_set_seqnum(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  else {
    pthread_spin_lock((pthread_spinlock_t *)(lVar1 + 0x38));
    paVar2 = avl_search(in_RSI,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    paVar2[-7].parent = in_RDX;
    pthread_spin_unlock((pthread_spinlock_t *)(lVar1 + 0x38));
  }
  return;
}

Assistant:

void fdb_kvs_set_seqnum(struct filemgr *file,
                           fdb_kvs_id_t id,
                           fdb_seqnum_t seqnum)
{
    struct kvs_header *kv_header = file->kv_header;
    struct kvs_node query, *node;
    struct avl_node *a;

    if (id == 0) {
        // default KV instance
        filemgr_set_seqnum(file, seqnum);
        return;
    }

    spin_lock(&kv_header->lock);
    query.id = id;
    a = avl_search(kv_header->idx_id, &query.avl_id, _kvs_cmp_id);
    node = _get_entry(a, struct kvs_node, avl_id);
    node->seqnum = seqnum;
    spin_unlock(&kv_header->lock);
}